

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eng_fat.c
# Opt level: O0

int ENGINE_register_complete(ENGINE *e)

{
  ENGINE_register_ciphers(e);
  ENGINE_register_digests(e);
  ENGINE_register_RSA(e);
  ENGINE_register_DSA(e);
  ENGINE_register_DH(e);
  ENGINE_register_EC((ENGINE *)e);
  ENGINE_register_RAND(e);
  ENGINE_register_pkey_meths(e);
  ENGINE_register_pkey_asn1_meths(e);
  return 1;
}

Assistant:

int ENGINE_register_complete(ENGINE *e)
{
    ENGINE_register_ciphers(e);
    ENGINE_register_digests(e);
    ENGINE_register_RSA(e);
#ifndef OPENSSL_NO_DSA
    ENGINE_register_DSA(e);
#endif
#ifndef OPENSSL_NO_DH
    ENGINE_register_DH(e);
#endif
#ifndef OPENSSL_NO_EC
    ENGINE_register_EC(e);
#endif
    ENGINE_register_RAND(e);
    ENGINE_register_pkey_meths(e);
    ENGINE_register_pkey_asn1_meths(e);
    return 1;
}